

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::locate_sos_marker(jpeg_decoder *this)

{
  int iVar1;
  int c;
  jpeg_decoder *this_local;
  
  iVar1 = process_markers(this);
  if (iVar1 == 0xd9) {
    this_local._4_4_ = 0;
  }
  else {
    if (iVar1 != 0xda) {
      stop_decoding(this,JPGD_UNEXPECTED_MARKER);
    }
    read_sos_marker(this);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int jpeg_decoder::locate_sos_marker()
{
  int c;

  c = process_markers();

  if (c == M_EOI)
    return JPGD_FALSE;
  else if (c != M_SOS)
    stop_decoding(JPGD_UNEXPECTED_MARKER);

  read_sos_marker();

  return JPGD_TRUE;
}